

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O3

void __thiscall Mapper004::writeHandler(Mapper004 *this,uint16_t addr,uint8_t value)

{
  Console *this_00;
  PPU *this_01;
  
  if ((addr & 1) == 0 && (short)addr < -0x6001) {
    this->rommode = value >> 6 & 1;
    this->vrommode = value >> 7;
    this->reg = value & 7;
  }
  else {
    if ((ushort)(addr + 0x6000) < 0xe001 || (addr & 1) == 0) {
      if ((ushort)(addr + 0x6000) < 0x1fff && (addr & 1) == 0) {
        this_00 = Console::Instance();
        this_01 = Console::getPPU(this_00);
        PPU::setMirroring(this_01,(uint)(value & 1));
        return;
      }
      if ((0xe000 < (ushort)(addr + 0x4000) & (byte)addr) == 0) {
        if ((ushort)(addr + 0x4000) < 0x1fff && (addr & 1) == 0) {
          this->reloadVal = value;
        }
        else if ((ushort)(addr + 0x2000) < 0xe001 || (addr & 1) == 0) {
          if ((ushort)(addr + 0x2000) < 0x1fff && (addr & 1) == 0) {
            this->irqEnabled = false;
          }
          else if (0xe000 < addr && (addr & 1) != 0) {
            this->irqEnabled = true;
          }
        }
        else {
          this->counter = this->reloadVal;
        }
      }
      return;
    }
    this->regs[this->reg] = value;
  }
  switchBanks(this);
  return;
}

Assistant:

void Mapper004::writeHandler(uint16_t addr, uint8_t value) {
    if (addr >= 0x8000 && addr <= 0x9FFE && addr % 2 == 0) {
        rommode = ((value >> 6) & 1);
        vrommode = ((value >> 7) & 1);
        reg = value & 0x7;
        switchBanks();
    } else if (addr >= 0x8001 && addr <= 0x9FFF && addr % 2 == 1) {
        regs[reg] = value;
        switchBanks();
    } else if (addr >= 0xA000 && addr <= 0xBFFE && addr % 2 == 0) {
	Console &c = Console::Instance();
	c.getPPU()->setMirroring(value & 1);
    } else if (addr >= 0xA001 && addr <= 0xBFFF && addr % 2 == 1) {
        // ram protect(do we need this right now?)
    } else if (addr >= 0xC000 && addr <= 0xDFFE && addr % 2 == 0) {
        reloadVal = value;
    } else if (addr >= 0xC001 && addr <= 0xDFFF && addr % 2 == 1) {
        counter = reloadVal;
    } else if (addr >= 0xE000 && addr <= 0xFFFE && addr % 2 == 0) {
        irqEnabled = false;
    } else if (addr >= 0xE001 && addr <= 0xFFFF && addr % 2 == 1) {
        irqEnabled = true;
    }
}